

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QRegularExpressionMatchIterator __thiscall
QRegularExpression::globalMatchView
          (QRegularExpression *this,QStringView subjectView,qsizetype offset,MatchType matchType,
          MatchOptions matchOptions)

{
  QStringView subjectView_00;
  qsizetype in_RCX;
  undefined8 in_RDX;
  QFlagsStorage<QRegularExpression::MatchOption> matchOptions_00;
  QRegularExpressionMatchIteratorPrivate *in_RDI;
  QRegularExpression *in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  undefined4 in_stack_00000008;
  QRegularExpressionMatchIteratorPrivate *priv;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  MatchType in_stack_ffffffffffffff54;
  QRegularExpression *in_stack_ffffffffffffff58;
  QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> QVar1;
  undefined8 in_stack_ffffffffffffff98;
  MatchType matchType_00;
  undefined4 in_stack_ffffffffffffffa0;
  storage_type_conflict *psVar2;
  
  matchOptions_00.i = (Int)((ulong)in_RDX >> 0x20);
  matchType_00 = (MatchType)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  psVar2 = *(storage_type_conflict **)(in_FS_OFFSET + 0x28);
  QVar1.d.ptr = (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)
                (totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>)in_RDI;
  operator_new(0x20);
  subjectView_00.m_data = psVar2;
  subjectView_00.m_size = in_RCX;
  matchView(in_R8,subjectView_00,CONCAT44(in_R9D,in_stack_ffffffffffffffa0),matchType_00,
            (MatchOptions)matchOptions_00.i);
  QRegularExpressionMatchIteratorPrivate::QRegularExpressionMatchIteratorPrivate
            (in_RDI,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
             (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)
             SUB84((ulong)QVar1.d.ptr >> 0x20,0),
             (QRegularExpressionMatch *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_00000008));
  QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x72e667);
  QRegularExpressionMatchIterator::QRegularExpressionMatchIterator
            ((QRegularExpressionMatchIterator *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (QRegularExpressionMatchIteratorPrivate *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_00000008));
  if (*(storage_type_conflict **)(in_FS_OFFSET + 0x28) == psVar2) {
    return (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)QVar1.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatchIterator QRegularExpression::globalMatchView(QStringView subjectView,
                                                                    qsizetype offset,
                                                                    MatchType matchType,
                                                                    MatchOptions matchOptions) const
{
    QRegularExpressionMatchIteratorPrivate *priv =
            new QRegularExpressionMatchIteratorPrivate(*this,
                                                       matchType,
                                                       matchOptions,
                                                       matchView(subjectView, offset, matchType, matchOptions));

    return QRegularExpressionMatchIterator(*priv);
}